

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

int above(cbtVector3 *vertices,cbtInt3 *t,cbtVector3 *p,cbtScalar epsilon)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar5;
  
  cVar5 = TriNormal(vertices + t->x,vertices + t->y,vertices + t->z);
  iVar1 = t->x;
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = cVar5.m_floats._0_8_;
  auVar2 = vmovshdup_avx(auVar2);
  auVar3._8_8_ = extraout_XMM0_Qb;
  auVar3._0_8_ = cVar5.m_floats._0_8_;
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(auVar2._0_4_ *
                                         (p->m_floats[1] - vertices[iVar1].m_floats[1]))),auVar3,
                           ZEXT416((uint)(p->m_floats[0] - vertices[iVar1].m_floats[0])));
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = cVar5.m_floats._8_8_;
  auVar2 = vfmadd231ss_fma(auVar2,auVar4,
                           ZEXT416((uint)(p->m_floats[2] - vertices[iVar1].m_floats[2])));
  return (int)(epsilon < auVar2._0_4_);
}

Assistant:

int above(cbtVector3 *vertices, const cbtInt3 &t, const cbtVector3 &p, cbtScalar epsilon)
{
	cbtVector3 n = TriNormal(vertices[t[0]], vertices[t[1]], vertices[t[2]]);
	return (cbtDot(n, p - vertices[t[0]]) > epsilon);  // EPSILON???
}